

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddColorDiagnosticsFlags(cmLocalGenerator *this,string *flags,string *lang)

{
  cmMakefile *this_00;
  undefined8 uVar1;
  bool bVar2;
  string *option;
  pointer pbVar3;
  cmValue diag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string colorFlagName;
  cmValue local_d0;
  undefined1 local_c8 [56];
  string local_90;
  string local_70;
  cmAlphaNum local_50;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"CMAKE_COLOR_DIAGNOSTICS",(allocator<char> *)&local_50);
  local_d0 = cmMakefile::GetDefinition(this_00,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  bVar2 = cmValue::IsSet(&local_d0);
  if (bVar2) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    bVar2 = cmValue::IsOn(&local_d0);
    if (bVar2) {
      local_c8._0_8_ = &DAT_00000006;
      local_c8._8_8_ = "CMAKE_";
      local_50.View_._M_str = (lang->_M_dataplus)._M_p;
      local_50.View_._M_len = lang->_M_string_length;
      cmStrCat<char[35]>(&local_70,(cmAlphaNum *)local_c8,&local_50,
                         (char (*) [35])"_COMPILE_OPTIONS_COLOR_DIAGNOSTICS");
    }
    else {
      local_c8._0_8_ = &DAT_00000006;
      local_c8._8_8_ = "CMAKE_";
      local_50.View_._M_str = (lang->_M_dataplus)._M_p;
      local_50.View_._M_len = lang->_M_string_length;
      cmStrCat<char[39]>(&local_70,(cmAlphaNum *)local_c8,&local_50,
                         (char (*) [39])"_COMPILE_OPTIONS_COLOR_DIAGNOSTICS_OFF");
    }
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    local_c8._0_8_ = (pointer)0x0;
    local_c8._8_8_ = (pointer)0x0;
    local_c8._16_8_ = 0;
    cmMakefile::GetDefExpandList
              (this->Makefile,&local_90,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c8,false);
    uVar1 = local_c8._8_8_;
    for (pbVar3 = (pointer)local_c8._0_8_; pbVar3 != (pointer)uVar1; pbVar3 = pbVar3 + 1) {
      (*this->_vptr_cmLocalGenerator[8])(this,flags,pbVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void cmLocalGenerator::AddColorDiagnosticsFlags(std::string& flags,
                                                const std::string& lang)
{
  cmValue diag = this->Makefile->GetDefinition("CMAKE_COLOR_DIAGNOSTICS");
  if (diag.IsSet()) {
    std::string colorFlagName;
    if (diag.IsOn()) {
      colorFlagName =
        cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS");
    } else {
      colorFlagName =
        cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_COLOR_DIAGNOSTICS_OFF");
    }

    std::vector<std::string> options;
    this->Makefile->GetDefExpandList(colorFlagName, options);

    for (std::string const& option : options) {
      this->AppendFlagEscape(flags, option);
    }
  }
}